

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testSpecDowngradeFlexibleShapes(void)

{
  bool bVar1;
  int32 iVar2;
  ModelDescription *pMVar3;
  FeatureDescription *pFVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  ArrayFeatureType_ShapeRange *this;
  SizeRange *this_00;
  NeuralNetwork *this_01;
  NeuralNetworkLayer *this_02;
  ostream *poVar7;
  Model *this_03;
  undefined1 local_d8 [8];
  Model mlmodel;
  undefined1 local_b8 [8];
  Result res;
  UnaryFunctionLayerParams *params;
  NeuralNetworkLayer *layer;
  NeuralNetwork *nn;
  ArrayFeatureType *outvec;
  FeatureDescription *out;
  SizeRange *array_shape1_range;
  ArrayFeatureType *array_type;
  FeatureDescription *topIn;
  undefined1 local_40 [8];
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)local_40);
  CoreML::Specification::Model::set_specificationversion((Model *)local_40,3);
  pMVar3 = CoreML::Specification::Model::mutable_description((Model *)local_40);
  pFVar4 = CoreML::Specification::ModelDescription::add_input(pMVar3);
  CoreML::Specification::FeatureDescription::set_name(pFVar4,"input");
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar6,ArrayFeatureType_ArrayDataType_FLOAT32);
  this = CoreML::Specification::ArrayFeatureType::mutable_shaperange(pAVar6);
  this_00 = CoreML::Specification::ArrayFeatureType_ShapeRange::add_sizeranges(this);
  CoreML::Specification::SizeRange::set_lowerbound(this_00,10);
  CoreML::Specification::SizeRange::set_upperbound(this_00,10);
  pMVar3 = CoreML::Specification::Model::mutable_description((Model *)local_40);
  pFVar4 = CoreML::Specification::ModelDescription::add_output(pMVar3);
  CoreML::Specification::FeatureDescription::set_name(pFVar4,"probs");
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar4);
  pAVar6 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (pAVar6,ArrayFeatureType_ArrayDataType_DOUBLE);
  this_01 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)local_40);
  this_02 = CoreML::Specification::NeuralNetwork::add_layers(this_01);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_02,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_02,"probs");
  res.m_message.field_2._8_8_ = CoreML::Specification::NeuralNetworkLayer::mutable_unary(this_02);
  CoreML::Specification::UnaryFunctionLayerParams::set_type
            ((UnaryFunctionLayerParams *)res.m_message.field_2._8_8_,
             UnaryFunctionLayerParams_Operation_ABS);
  CoreML::validate<(MLModelType)500>((Result *)local_b8,(Model *)local_40);
  bVar1 = CoreML::Result::good((Result *)local_b8);
  if (bVar1) {
    CoreML::Model::Model((Model *)local_d8,(Model *)local_40);
    this_03 = CoreML::Model::getProto((Model *)local_d8);
    iVar2 = CoreML::Specification::Model::specificationversion(this_03);
    if (iVar2 != 3) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x1050);
      poVar7 = std::operator<<(poVar7,": error: ");
      poVar7 = std::operator<<(poVar7,
                               "mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS12"
                              );
      poVar7 = std::operator<<(poVar7," was false, expected true.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    m1._oneof_case_[0]._1_3_ = 0;
    m1._oneof_case_[0]._0_1_ = iVar2 != 3;
    mlmodel.m_spec.super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 1;
    CoreML::Model::~Model((Model *)local_d8);
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x104c);
    poVar7 = std::operator<<(poVar7,": error: ");
    poVar7 = std::operator<<(poVar7,"(res).good()");
    poVar7 = std::operator<<(poVar7," was false, expected true.");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    m1._oneof_case_[0] = 1;
    mlmodel.m_spec.super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._4_4_ = 1;
  }
  CoreML::Result::~Result((Result *)local_b8);
  CoreML::Specification::Model::~Model((Model *)local_40);
  return m1._oneof_case_[0];
}

Assistant:

int testSpecDowngradeFlexibleShapes() {

    Specification::Model m1;
    m1.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS12);

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *array_type = topIn->mutable_type()->mutable_multiarraytype();
    array_type->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT32);

    auto *array_shape1_range = array_type->mutable_shaperange()->add_sizeranges();
    array_shape1_range->set_lowerbound(10);
    array_shape1_range->set_upperbound(10);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("probs");
    auto *outvec = out->mutable_type()->mutable_multiarraytype();
    outvec->set_datatype(Specification::ArrayFeatureType_ArrayDataType_DOUBLE);

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *layer = nn->add_layers();
    layer->add_input("input");
    layer->add_output("probs");

    auto *params = layer->mutable_unary();
    params->set_type(Specification::UnaryFunctionLayerParams::ABS);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    Model mlmodel = Model(m1);

    ML_ASSERT(mlmodel.getProto().specificationversion() == MLMODEL_SPECIFICATION_VERSION_IOS12);

    return 0;

}